

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profiler_unittest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  __pid_t _Var1;
  int iVar2;
  TestingPortal *pTVar3;
  undefined8 *puVar4;
  int local_1c;
  int num_forks;
  char **argv_local;
  int argc_local;
  
  pTVar3 = tcmalloc::TestingPortal::Get();
  puVar4 = (undefined8 *)(**(code **)(*(long *)pTVar3 + 0x28))();
  *puVar4 = 0x80000;
  if ((argc < 3) && ((argc != 2 || (*argv[1] != '-')))) {
    local_1c = 0;
    if (argc == 2) {
      local_1c = atoi(argv[1]);
    }
    TestHeapProfilerStartStopIsRunning();
    TestDumpHeapProfiler();
    Allocate(0,0x28,100);
    Deallocate(0,0x28);
    Allocate(0,0x28,100);
    Allocate(0,0x28,100);
    Allocate2(0x28,400,1000);
    Allocate2(400,1000,10000);
    Deallocate(0,1000);
    Allocate(0,100,100000);
    Deallocate(0,10);
    Deallocate(10,0x14);
    Deallocate(0x5a,100);
    Deallocate(0x14,0x5a);
    while( true ) {
      if (local_1c < 1) {
        printf("DONE.\n");
        return 0;
      }
      _Var1 = fork();
      if (_Var1 == -1) break;
      if (_Var1 == 0) {
        iVar2 = execl(*argv,*argv,0);
        return iVar2;
      }
      wait((void *)0x0);
      local_1c = local_1c + -1;
    }
    printf("FORK failed!\n");
    return 1;
  }
  printf("USAGE: %s [number of children to fork]\n",*argv);
  exit(0);
}

Assistant:

int main(int argc, char** argv) {
  tcmalloc::TestingPortal::Get()->GetSampleParameter() = 512 << 10;

  if (argc > 2 || (argc == 2 && argv[1][0] == '-')) {
    printf("USAGE: %s [number of children to fork]\n", argv[0]);
    exit(0);
  }
  int num_forks = 0;
  if (argc == 2) {
    num_forks = atoi(argv[1]);
  }

  TestHeapProfilerStartStopIsRunning();
  TestDumpHeapProfiler();

  Allocate(0, 40, 100);
  Deallocate(0, 40);

  Allocate(0, 40, 100);
  Allocate(0, 40, 100);
  Allocate2(40, 400, 1000);
  Allocate2(400, 1000, 10000);
  Deallocate(0, 1000);

  Allocate(0, 100, 100000);
  Deallocate(0, 10);
  Deallocate(10, 20);
  Deallocate(90, 100);
  Deallocate(20, 90);

  while (num_forks-- > 0) {
    switch (fork()) {
      case -1:
        printf("FORK failed!\n");
        return 1;
      case 0:             // child
        return execl(argv[0], argv[0], nullptr);   // run child with no args
      default:
        wait(nullptr);       // we'll let the kids run one at a time
    }
  }

  printf("DONE.\n");

  return 0;
}